

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O3

void __thiscall AllRgbWidget::onResetPixelsRequested(AllRgbWidget *this)

{
  undefined8 uVar1;
  AllRgbWidget *this_00;
  code *local_78 [2];
  code *local_68;
  code *local_60;
  QImage local_50 [24];
  undefined8 local_28;
  
  this_00 = (AllRgbWidget *)&stack0xffffffffffffffc8;
  QImage::QImage((QImage *)this_00,0x1000,0x1000,Format_RGB32);
  QPaintDevice::QPaintDevice((QPaintDevice *)local_78);
  uVar1 = local_28;
  local_78[0] = QImage::QImage;
  local_28 = 0;
  local_68 = *(code **)&this->field_0xa0;
  *(undefined8 *)&this->field_0xa0 = uVar1;
  QImage::~QImage((QImage *)local_78);
  QImage::~QImage((QImage *)this_00);
  local_78[0] = (code *)0x0;
  local_78[1] = (code *)0x0;
  local_60 = std::
             _Function_handler<void_(QImage_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AllRgbWidget.cpp:55:27)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(QImage_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AllRgbWidget.cpp:55:27)>
             ::_M_manager;
  ForEachPixel(this_00,&this->allRgb_,(function<void_(QImage_&,_int,_int)> *)local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  QImage::QImage(local_50,&this->allRgb_);
  onAllRgbUpdated(this,local_50);
  QImage::~QImage(local_50);
  return;
}

Assistant:

void AllRgbWidget::onResetPixelsRequested()
{
    allRgb_ = QImage(4096, 4096, QImage::Format::Format_RGB32);

    ForEachPixel(allRgb_, [](QImage& target, int x, int y)
    {
        target.setPixel(x, y, x + (target.width() * y));
    });

    emit onAllRgbUpdated(allRgb_);
}